

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O2

void __thiscall
libtorrent::dht_immutable_item_alert::~dht_immutable_item_alert(dht_immutable_item_alert *this)

{
  entry::~entry(&this->item);
  operator_delete(this,0x60);
  return;
}

Assistant:

struct TORRENT_EXPORT dht_immutable_item_alert final : alert
	{
		// internal
		dht_immutable_item_alert(aux::stack_allocator& alloc, sha1_hash const& t
			, entry const& i);

		TORRENT_DEFINE_ALERT_PRIO(dht_immutable_item_alert, 74, alert_priority_critical)

		static constexpr alert_category_t static_category = alert_category::dht;

		std::string message() const override;

		// the target hash of the immutable item. This must
		// match the SHA-1 hash of the bencoded form of ``item``.
		sha1_hash target;

		// the data for this item
		entry item;
	}